

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::cmServer(cmServer *this,cmConnection *conn,bool supportExperimental)

{
  cmServerProtocol1 *this_00;
  
  cmServerBase::cmServerBase(&this->super_cmServerBase,conn);
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmServer_00538dd8;
  (this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->SupportExperimental = supportExperimental;
  this->Protocol = (cmServerProtocol *)0x0;
  (this->SupportedProtocols).
  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SupportedProtocols).
  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SupportedProtocols).
  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (cmServerProtocol1 *)operator_new(0xe0);
  cmServerProtocol1::cmServerProtocol1(this_00);
  RegisterProtocol(this,(cmServerProtocol *)this_00);
  return;
}

Assistant:

cmServer::cmServer(cmConnection* conn, bool supportExperimental)
  : cmServerBase(conn)
  , SupportExperimental(supportExperimental)
{
  // Register supported protocols:
  this->RegisterProtocol(new cmServerProtocol1);
}